

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BehaviourTree.h
# Opt level: O3

void __thiscall BehaviourTree::DecoratorNode::~DecoratorNode(DecoratorNode *this)

{
  pointer pcVar1;
  
  if (this->child != (Node *)0x0) {
    this->child = (Node *)0x0;
  }
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__Node_0010f660;
  pcVar1 = (this->super_Node)._name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_Node)._name.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~DecoratorNode() {
            if (child != nullptr) {
                //delete child;
                child = nullptr;
            }
        }